

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall
pbrt::Triangle::ToString_abi_cxx11_(string *__return_storage_ptr__,Triangle *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Point3<float> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar2 = *(long *)(lVar1 + 8);
  lVar3 = (long)this->triIndex * 0xc;
  lVar1 = *(long *)(lVar1 + 0x10);
  StringPrintf<int_const&,int_const&,pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Point3<float>const&>
            (__return_storage_ptr__,
             (pbrt *)"[ Triangle meshIndex: %d triIndex: %d -> p [ %s %s %s ] ]",(char *)this,
             &this->triIndex,(int *)((long)*(int *)(lVar2 + lVar3) * 0xc + lVar1),
             (Point3<float> *)((long)*(int *)(lVar2 + 4 + lVar3) * 0xc + lVar1),
             (Point3<float> *)((long)*(int *)(lVar2 + 8 + lVar3) * 0xc + lVar1),
             in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string Triangle::ToString() const {
    // Get triangle vertices in _p0_, _p1_, and _p2_
    auto mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    const Point3f &p0 = mesh->p[v[0]];
    const Point3f &p1 = mesh->p[v[1]];
    const Point3f &p2 = mesh->p[v[2]];

    return StringPrintf("[ Triangle meshIndex: %d triIndex: %d -> p [ %s %s %s ] ]",
                        meshIndex, triIndex, p0, p1, p2);
}